

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klvwalk.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  FILE *pFVar1;
  bool bVar2;
  IFileReader *this;
  Dictionary *pDVar3;
  ILogSink *pIVar4;
  int64_t iVar5;
  int iVar6;
  long ****pppplVar7;
  _List_node_base *local_720;
  allocator<char> local_711;
  long ***local_710;
  Result_t result;
  char *local_700;
  CommandOptions Options;
  FileReaderFactory defaultFactory;
  RIP RIP;
  long ***local_5f0 [2];
  ulong local_5e0;
  string local_5d8 [104];
  Partition TmpPart;
  long **local_4e8;
  int local_4b0;
  IFileReader local_3e8 [104];
  Result_t local_380 [104];
  Result_t local_318 [104];
  OP1aHeader Header;
  void *local_218;
  Result_t local_98 [104];
  
  CommandOptions::CommandOptions(&Options,argc,argv);
  if (Options.version_flag == true) {
    banner((FILE *)_stdout);
  }
  if (Options.help_flag == true) {
    usage((FILE *)_stdout);
  }
  iVar6 = 0;
  if ((Options.version_flag == false) && (Options.help_flag == false)) {
    if (Options.error_flag == true) {
      fprintf(_stderr,"There was a problem. Type %s -h for help.\n","klvwalk");
      iVar6 = 3;
    }
    else {
      Kumu::Result_t::Result_t(&result,(Result_t *)Kumu::RESULT_OK);
      local_720 = Options.inFileList.
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
      local_710 = (long ***)local_5f0;
      while( true ) {
        if (_result < 0) break;
        if (local_720 == (_List_node_base *)&Options.inFileList) {
          iVar6 = 0;
          goto LAB_0010609b;
        }
        this = (IFileReader *)Kumu::FileReaderFactory::CreateFileReader();
        if (Options.verbose_flag == true) {
          fprintf(_stderr,"Opening file %s\n",local_720[1]._M_next);
        }
        if (Options.read_mxf_flag == true) {
          pDVar3 = (Dictionary *)ASDCP::DefaultCompositeDict();
          ASDCP::MXF::OP1aHeader::OP1aHeader(&Header,pDVar3);
          ASDCP::MXF::RIP::RIP(&RIP,pDVar3);
          (**(code **)(*(long *)this + 0x10))((_IO_FILE *)&TmpPart,this,local_720 + 1);
          Kumu::Result_t::operator=(&result,(Result_t *)&TmpPart);
          Kumu::Result_t::~Result_t((Result_t *)&TmpPart);
          if (-1 < _result) {
            ASDCP::MXF::SeekToRIP((IFileReader *)&TmpPart);
            Kumu::Result_t::operator=(&result,(Result_t *)&TmpPart);
            Kumu::Result_t::~Result_t((Result_t *)&TmpPart);
            if (_result < 0) {
              pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
              Kumu::ILogSink::Error(pIVar4,"read_mxf SeekToRIP failed: %s\n",local_700);
            }
            else {
              ASDCP::MXF::RIP::InitFromFile((IFileReader *)&TmpPart);
              Kumu::Result_t::operator=(&result,(Result_t *)&TmpPart);
              Kumu::Result_t::~Result_t((Result_t *)&TmpPart);
              if (_result < 0) {
                pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
                Kumu::ILogSink::Error(pIVar4,"File contains no RIP\n");
                Kumu::Result_t::operator=(&result,(Result_t *)Kumu::RESULT_OK);
              }
              else if ((long ****)local_5f0[0] == local_5f0) {
                pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
                Kumu::ILogSink::Error(pIVar4,"RIP contains no Pairs.\n");
              }
              (**(code **)(*(long *)this + 0x28))(local_318,this,0);
              Kumu::Result_t::~Result_t(local_318);
            }
            if (-1 < _result) {
              ASDCP::MXF::OP1aHeader::InitFromFile((IFileReader *)&TmpPart);
              Kumu::Result_t::operator=(&result,(Result_t *)&TmpPart);
              Kumu::Result_t::~Result_t((Result_t *)&TmpPart);
              if ((-1 < _result) &&
                 (ASDCP::MXF::OP1aHeader::Dump((_IO_FILE *)&Header), -1 < _result)) {
                pppplVar7 = (long ****)local_5f0[0];
                if (2 < local_5e0) {
                  while (pppplVar7 = (long ****)*pppplVar7, pppplVar7 != local_5f0) {
                    if (_result < 0) goto LAB_00106066;
                    (**(code **)(*(long *)this + 0x28))((_IO_FILE *)&TmpPart,this,pppplVar7[4]);
                    Kumu::Result_t::operator=(&result,(Result_t *)&TmpPart);
                    Kumu::Result_t::~Result_t((Result_t *)&TmpPart);
                    if (-1 < _result) {
                      ASDCP::MXF::Partition::Partition(&TmpPart,pDVar3);
                      ASDCP::MXF::Partition::InitFromFile((IFileReader *)local_5d8);
                      Kumu::Result_t::operator=(&result,(Result_t *)local_5d8);
                      Kumu::Result_t::~Result_t((Result_t *)local_5d8);
                      if ((-1 < _result) && (local_4b0 != 0)) {
                        ASDCP::MXF::Partition::Dump((_IO_FILE *)&TmpPart);
                      }
                      ASDCP::MXF::Partition::~Partition(&TmpPart);
                    }
                  }
                  if (_result < 0) goto LAB_00106066;
                }
                ASDCP::MXF::OPAtomIndexFooter::OPAtomIndexFooter
                          ((OPAtomIndexFooter *)&TmpPart,pDVar3);
                (**(code **)(*(long *)this + 0x28))((Result_t *)local_5d8,this,local_218);
                Kumu::Result_t::operator=(&result,(Result_t *)local_5d8);
                Kumu::Result_t::~Result_t((Result_t *)local_5d8);
                if (-1 < _result) {
                  ASDCP::MXF::OPAtomIndexFooter::InitFromFile((IFileReader *)local_5d8);
                  Kumu::Result_t::operator=(&result,(Result_t *)local_5d8);
                  Kumu::Result_t::~Result_t((Result_t *)local_5d8);
                  if (-1 < _result) {
                    ASDCP::MXF::OPAtomIndexFooter::Dump((_IO_FILE *)&TmpPart);
                  }
                }
                ASDCP::MXF::OPAtomIndexFooter::~OPAtomIndexFooter((OPAtomIndexFooter *)&TmpPart);
                if (-1 < _result) {
                  ASDCP::MXF::RIP::Dump((_IO_FILE *)&RIP);
                }
              }
            }
          }
LAB_00106066:
          ASDCP::MXF::RIP::~RIP(&RIP);
          ASDCP::MXF::OP1aHeader::~OP1aHeader(&Header);
LAB_0010607e:
          (**(code **)(*(long *)this + 8))(this);
        }
        else {
          if (Options.walk_parts_flag == true) {
            pDVar3 = (Dictionary *)ASDCP::DefaultCompositeDict();
            ASDCP::MXF::OP1aHeader::OP1aHeader(&Header,pDVar3);
            ASDCP::MXF::RIP::RIP(&RIP,pDVar3);
            std::__cxx11::string::string<std::allocator<char>>
                      (local_5d8,(char *)local_720[1]._M_next,&local_711);
            (**(code **)(*(long *)this + 0x10))((_IO_FILE *)&TmpPart,this,local_5d8);
            Kumu::Result_t::operator=(&result,(Result_t *)&TmpPart);
            Kumu::Result_t::~Result_t((Result_t *)&TmpPart);
            std::__cxx11::string::~string(local_5d8);
            if (_result < 0) {
LAB_00105cc3:
              pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
              Kumu::ILogSink::Error(pIVar4,"walk_parts SeekToRIP failed: %s\n",local_700);
            }
            else {
              ASDCP::MXF::SeekToRIP((IFileReader *)&TmpPart);
              Kumu::Result_t::operator=(&result,(Result_t *)&TmpPart);
              Kumu::Result_t::~Result_t((Result_t *)&TmpPart);
              if (_result < 0) goto LAB_00105cc3;
              ASDCP::MXF::RIP::InitFromFile((IFileReader *)&TmpPart);
              Kumu::Result_t::operator=(&result,(Result_t *)&TmpPart);
              Kumu::Result_t::~Result_t((Result_t *)&TmpPart);
              if (_result < 0) {
                pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
                Kumu::ILogSink::Error(pIVar4,"File contains no RIP\n");
                Kumu::Result_t::operator=(&result,(Result_t *)Kumu::RESULT_OK);
              }
              else if (local_5f0[0] == local_710) {
                pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
                Kumu::ILogSink::Error(pIVar4,"RIP contains no Pairs.\n");
              }
              (**(code **)(*(long *)this + 0x28))(local_380,this,0,0);
              Kumu::Result_t::~Result_t(local_380);
            }
            if (-1 < _result) {
              ASDCP::MXF::RIP::Dump((_IO_FILE *)&RIP);
              pppplVar7 = (long ****)local_710;
              while (pppplVar7 = (long ****)*pppplVar7, pppplVar7 != (long ****)local_710) {
                (**(code **)(*(long *)this + 0x28))(local_98,this,pppplVar7[4]);
                Kumu::Result_t::~Result_t(local_98);
                ASDCP::MXF::Partition::Partition(&TmpPart,pDVar3);
                ASDCP::MXF::Partition::InitFromFile(local_3e8);
                Kumu::Result_t::~Result_t((Result_t *)local_3e8);
                if ((long ***)local_4e8 != pppplVar7[4]) {
                  pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
                  Kumu::ILogSink::Error
                            (pIVar4,"ThisPartition value error: wanted=%qu, got=%qu\n",local_4e8);
                }
                ASDCP::MXF::Partition::Dump((_IO_FILE *)&TmpPart);
                ASDCP::MXF::Partition::~Partition(&TmpPart);
              }
            }
            goto LAB_00106066;
          }
          ASDCP::KLVFilePacket::KLVFilePacket((KLVFilePacket *)&Header);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&RIP,(char *)local_720[1]._M_next,(allocator<char> *)local_5d8);
          (**(code **)(*(long *)this + 0x10))((_IO_FILE *)&TmpPart,this,(string *)&RIP);
          Kumu::Result_t::operator=(&result,(Result_t *)&TmpPart);
          Kumu::Result_t::~Result_t((Result_t *)&TmpPart);
          std::__cxx11::string::~string((string *)&RIP);
          if (-1 < _result) {
            ASDCP::KLVFilePacket::InitFromFile((IFileReader *)&TmpPart);
            Kumu::Result_t::operator=(&result,(Result_t *)&TmpPart);
            Kumu::Result_t::~Result_t((Result_t *)&TmpPart);
          }
          iVar5 = 0;
          while (-1 < _result) {
            fprintf(_stdout,"@0x%08llx: ",iVar5);
            pFVar1 = _stdout;
            bVar2 = (bool)ASDCP::DefaultCompositeDict();
            ASDCP::KLVPacket::Dump((_IO_FILE *)&Header,(Dictionary *)pFVar1,bVar2);
            iVar5 = Kumu::IFileReader::TellPosition(this);
            ASDCP::KLVFilePacket::InitFromFile((IFileReader *)&TmpPart);
            Kumu::Result_t::operator=(&result,(Result_t *)&TmpPart);
            Kumu::Result_t::~Result_t((Result_t *)&TmpPart);
            if ((_result == Kumu::RESULT_ALLOC) && (Options.allow_skip_flag == true)) {
              fwrite("Skipping huge packet, reporting zero packet size.\n",0x32,1,_stdout);
              Kumu::Result_t::operator=(&result,(Result_t *)Kumu::RESULT_OK);
            }
          }
          if (_result == Kumu::RESULT_ENDOFFILE) {
            Kumu::Result_t::operator=(&result,(Result_t *)Kumu::RESULT_OK);
          }
          ASDCP::KLVFilePacket::~KLVFilePacket((KLVFilePacket *)&Header);
          if (this != (IFileReader *)0x0) goto LAB_0010607e;
        }
        local_720 = local_720->_M_next;
      }
      fputs("Program stopped on error.\n",_stderr);
      iVar6 = 1;
      if (_result != Kumu::RESULT_FAIL) {
        fputs(local_700,_stderr);
        fputc(10,_stderr);
        iVar6 = 1;
      }
LAB_0010609b:
      Kumu::Result_t::~Result_t(&result);
    }
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&Options.inFileList.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  return iVar6;
}

Assistant:

int
main(int argc, const char** argv)
{
  CommandOptions Options(argc, argv);

  if ( Options.version_flag )
    banner();

  if ( Options.help_flag )
    usage();

  if ( Options.version_flag || Options.help_flag )
    return 0;

  if ( Options.error_flag )
    {
      fprintf(stderr, "There was a problem. Type %s -h for help.\n", PROGRAM_NAME);
      return 3;
    }

  FileList_t::iterator fi;
  Result_t result = RESULT_OK;
  Kumu::FileReaderFactory defaultFactory;

  for ( fi = Options.inFileList.begin(); ASDCP_SUCCESS(result) && fi != Options.inFileList.end(); fi++ )
    {
      ASDCP::mem_ptr<Kumu::IFileReader> Reader(defaultFactory.CreateFileReader());
      if (Options.verbose_flag)
	fprintf(stderr, "Opening file %s\n", ((*fi).c_str()));
      
      if ( Options.read_mxf_flag ) // dump MXF
	{      
	  const Dictionary* Dict = &DefaultCompositeDict();
	  ASDCP::MXF::OP1aHeader Header(Dict);
	  ASDCP::MXF::RIP RIP(Dict);
	  
	  result = Reader->OpenRead(*fi);
	  
	  if ( ASDCP_SUCCESS(result) )
	    {
		  result = MXF::SeekToRIP(*Reader);
	      
	      if ( ASDCP_SUCCESS(result) )
		{
		  result = RIP.InitFromFile(*Reader);
		  ui32_t test_s = RIP.PairArray.size();

		  if ( ASDCP_FAILURE(result) )
		    {
		      DefaultLogSink().Error("File contains no RIP\n");
		      result = RESULT_OK;
		    }
		  else if ( RIP.PairArray.empty() )
		    {
		      DefaultLogSink().Error("RIP contains no Pairs.\n");
		    }

		  Reader->Seek(0);
		}
	      else
		{
		  DefaultLogSink().Error("read_mxf SeekToRIP failed: %s\n", result.Label());
		}
	    }

	  if ( ASDCP_SUCCESS(result) )
        result = Header.InitFromFile(*Reader);
	  
	  if ( ASDCP_SUCCESS(result) )
	    Header.Dump(stdout);
	  
	  if ( ASDCP_SUCCESS(result) && RIP.PairArray.size() > 2 )
	    {
	      MXF::RIP::const_pair_iterator pi = RIP.PairArray.begin();

	      for ( pi++; pi != RIP.PairArray.end() && ASDCP_SUCCESS(result); pi++ )
		{
		  result = Reader->Seek((*pi).ByteOffset);

		  if ( ASDCP_SUCCESS(result) )
		    {
		      MXF::Partition TmpPart(Dict);
              result = TmpPart.InitFromFile(*Reader);

		      if ( ASDCP_SUCCESS(result) && TmpPart.BodySID > 0 )
			TmpPart.Dump(stdout);
		    }
		}
	    }

	  if ( ASDCP_SUCCESS(result) )
	    {
	      ASDCP::MXF::OPAtomIndexFooter Index(Dict);
	      result = Reader->Seek(Header.FooterPartition);
	      
	      if ( ASDCP_SUCCESS(result) )
		{
		  Index.m_Lookup = &Header.m_Primer;
          result = Index.InitFromFile(*Reader);
		}
	      
	      if ( ASDCP_SUCCESS(result) )
		Index.Dump(stdout);
	    }

	  if ( ASDCP_SUCCESS(result) )
	    RIP.Dump(stdout);
	}
      else if ( Options.walk_parts_flag )
	{
	  const Dictionary* Dict = &DefaultCompositeDict();
	  ASDCP::MXF::OP1aHeader Header(Dict);
	  ASDCP::MXF::RIP RIP(Dict);
	  
	  result = Reader->OpenRead((*fi).c_str());
	  
	  if ( ASDCP_SUCCESS(result) )
        result = MXF::SeekToRIP(*Reader);

	  if ( ASDCP_SUCCESS(result) )
	    {
          result = RIP.InitFromFile(*Reader);
	      ui32_t test_s = RIP.PairArray.size();

	      if ( ASDCP_FAILURE(result) )
		{
		  DefaultLogSink().Error("File contains no RIP\n");
		  result = RESULT_OK;
		}
	      else if ( RIP.PairArray.empty() )
		{
		  DefaultLogSink().Error("RIP contains no Pairs.\n");
		}

	      Reader->Seek(0);
	    }
	  else
	    {
	      DefaultLogSink().Error("walk_parts SeekToRIP failed: %s\n", result.Label());
	    }

	  if ( ASDCP_SUCCESS(result) )
	    {
	      RIP.Dump();

	      MXF::RIP::const_pair_iterator i;
	      for ( i = RIP.PairArray.begin(); i != RIP.PairArray.end(); ++i )
		{
		  Reader->Seek(i->ByteOffset);
		  MXF::Partition plain_part(Dict);
          plain_part.InitFromFile(*Reader);

		  if ( plain_part.ThisPartition != i->ByteOffset )
		    {
		      DefaultLogSink().Error("ThisPartition value error: wanted=%qu, got=%qu\n",
					     plain_part.ThisPartition, i->ByteOffset);
		    }

		  plain_part.Dump();
		}
	    }
	}
      else // dump klv
	{      
	  KLVFilePacket KP;
	  ui64_t pos = 0;

	  result = Reader->OpenRead((*fi).c_str());
	  
	  if ( ASDCP_SUCCESS(result) )
	    result = KP.InitFromFile(*Reader);
	  
	  while ( ASDCP_SUCCESS(result) )
	    {
	      fprintf(stdout, "@0x%08llx: ", pos);
	      KP.Dump(stdout, DefaultCompositeDict(), true);
	      pos = Reader->TellPosition();
	      result = KP.InitFromFile(*Reader);

              if ( result == RESULT_ALLOC && Options.allow_skip_flag )
                {
                  fprintf(stdout, "Skipping huge packet, reporting zero packet size.\n");
                  result = RESULT_OK;
                }
            }
	  
	  if( result == RESULT_ENDOFFILE )
	    result = RESULT_OK;
	}
    }

  if ( ASDCP_FAILURE(result) )
    {
      fputs("Program stopped on error.\n", stderr);
      
      if ( result != RESULT_FAIL )
	{
	  fputs(result, stderr);
	  fputc('\n', stderr);
	}
      
      return 1;
    }
  
  return 0;
}